

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

bool __thiscall PSEngine::basic_movement_resolution(PSEngine *this)

{
  bool bVar1;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *pvVar2;
  PSVector2i *this_00;
  reference __x;
  element_type *peVar3;
  size_type sVar4;
  map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
  *pmVar5;
  size_type sVar6;
  value_type local_2c0;
  key_type local_2b0;
  reference local_2a0;
  pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *pair_1;
  iterator __end2_2;
  iterator __begin2_2;
  map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
  *__range2_2;
  set<std::shared_ptr<CompiledGame::CollisionLayer>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
  current_col_layers;
  Cell *cell_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *__range1_2;
  ObjectMoveType local_21c;
  pair<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> local_218;
  allocator<char> local_1f9;
  string local_1f8 [32];
  string local_1d8 [32];
  _Self local_1b8;
  _Self local_1b0;
  allocator<char> local_1a1;
  string local_1a0 [32];
  string local_180 [32];
  PSVector2i local_160;
  Cell *local_158;
  Cell *dest_cell;
  ObjectMoveInfo *move_info_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *__range1_1;
  ObjectMoveInfo *elem;
  iterator __end2_1;
  iterator __begin2_1;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *__range2_1;
  undefined1 local_100 [8];
  ObjectMoveInfo move_info;
  string local_d8 [48];
  string local_a8 [32];
  reference local_88;
  pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *pair;
  iterator __end2;
  iterator __begin2;
  map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
  *__range2;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> current_cell_objects_to_move;
  Cell *cell;
  iterator __end1;
  iterator __begin1;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *__range1;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> objects_to_move;
  PSEngine *this_local;
  
  objects_to_move.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::vector
            ((vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *)&__range1);
  pvVar2 = &(this->m_current_level).cells;
  __end1 = std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::begin(pvVar2);
  cell = (Cell *)std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::end(pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
                                     *)&cell), bVar1) {
    current_cell_objects_to_move.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
                  ::operator*(&__end1);
    std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::vector
              ((vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *)&__range2);
    this_00 = &(current_cell_objects_to_move.
                super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage)->destination;
    __end2 = std::
             map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
             ::begin((map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                      *)this_00);
    pair = (pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *)
           std::
           map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
           ::end((map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                  *)this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&pair), bVar1) {
      local_88 = std::
                 _Rb_tree_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>
                 ::operator*(&__end2);
      if (local_88->second == Action) {
        local_88->second = Stationary;
      }
      else if (local_88->second != Stationary) {
        if (local_88->second == None) {
          if ((int)(this->m_config).log_verbosity < 5) {
            peVar3 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->m_logger);
            std::__cxx11::string::string(local_a8,(string *)&m_engine_log_cat_abi_cxx11_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_d8,"an objec move type is set to none, this should never happen",
                       (allocator<char> *)
                       ((long)&move_info.obj.
                               super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7));
            (*peVar3->_vptr_PSLogger[2])(peVar3,4,local_a8,local_d8);
            std::__cxx11::string::~string(local_d8);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&move_info.obj.
                               super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7));
            std::__cxx11::string::~string(local_a8);
            if (((this->m_config).log_operation_history_after_error & 1U) != 0) {
              print_operation_history(this);
            }
          }
        }
        else {
          basic_movement_resolution::ObjectMoveInfo::ObjectMoveInfo((ObjectMoveInfo *)local_100);
          local_100 = *(undefined1 (*) [8])
                       &(current_cell_objects_to_move.
                         super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage)->origin;
          std::shared_ptr<CompiledGame::PrimaryObject>::operator=
                    ((shared_ptr<CompiledGame::PrimaryObject> *)&move_info.destination,
                     &local_88->first);
          bVar1 = get_move_destination_coord
                            (this,(current_cell_objects_to_move.
                                   super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->origin,
                             local_88->second,&move_info.origin);
          if (bVar1) {
            std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::push_back
                      ((vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *)&__range2,
                       (value_type *)local_100);
          }
          else {
            this_local._7_1_ = 0;
          }
          bVar1 = !bVar1;
          basic_movement_resolution::ObjectMoveInfo::~ObjectMoveInfo((ObjectMoveInfo *)local_100);
          if (bVar1) goto LAB_0012b8bc;
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::begin
                         ((vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *)&__range2);
    elem = (ObjectMoveInfo *)
           std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::end
                     ((vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<ObjectMoveInfo_*,_std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>_>
                               *)&elem), bVar1) {
      __x = __gnu_cxx::
            __normal_iterator<ObjectMoveInfo_*,_std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>_>
            ::operator*(&__end2_1);
      std::
      map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
      ::erase((map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
               *)&(current_cell_objects_to_move.
                   super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage)->destination,&__x->obj);
      std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::push_back
                ((vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *)&__range1,__x);
      __gnu_cxx::
      __normal_iterator<ObjectMoveInfo_*,_std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>_>
      ::operator++(&__end2_1);
    }
    bVar1 = false;
LAB_0012b8bc:
    std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::~vector
              ((vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *)&__range2);
    if (bVar1) goto LAB_0012bfb7;
    __gnu_cxx::
    __normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::begin
                       ((vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *)&__range1);
  move_info_1 = (ObjectMoveInfo *)
                std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::end
                          ((vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<ObjectMoveInfo_*,_std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>_>
                             *)&move_info_1), bVar1) {
    dest_cell = (Cell *)__gnu_cxx::
                        __normal_iterator<ObjectMoveInfo_*,_std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>_>
                        ::operator*(&__end1_1);
    local_160.x = *(int *)&(dest_cell->objects)._M_t._M_impl.field_0x0;
    local_160.y = *(int *)&(dest_cell->objects)._M_t._M_impl.field_0x4;
    local_158 = get_cell_at(this,local_160);
    if (local_158 == (Cell *)0x0) {
      if ((int)(this->m_config).log_verbosity < 5) {
        peVar3 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_logger);
        std::__cxx11::string::string(local_180,(string *)&m_engine_log_cat_abi_cxx11_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1a0,"should not happen!",&local_1a1);
        (*peVar3->_vptr_PSLogger[2])(peVar3,4,local_180,local_1a0);
        std::__cxx11::string::~string(local_1a0);
        std::allocator<char>::~allocator(&local_1a1);
        std::__cxx11::string::~string(local_180);
        if (((this->m_config).log_operation_history_after_error & 1U) != 0) {
          print_operation_history(this);
        }
      }
      this_local._7_1_ = 0;
      goto LAB_0012bfb7;
    }
    local_1b0._M_node =
         (_Base_ptr)
         std::
         map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
         ::find(&local_158->objects,
                (key_type *)&(dest_cell->objects)._M_t._M_impl.super__Rb_tree_header);
    local_1b8._M_node =
         (_Base_ptr)
         std::
         map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
         ::end(&local_158->objects);
    bVar1 = std::operator!=(&local_1b0,&local_1b8);
    if (bVar1) {
      if ((int)(this->m_config).log_verbosity < 5) {
        peVar3 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_logger);
        std::__cxx11::string::string(local_1d8,(string *)&m_engine_log_cat_abi_cxx11_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1f8,
                   "this object already exist in the destination cell, basic movement resolution cannot proceed."
                   ,&local_1f9);
        (*peVar3->_vptr_PSLogger[2])(peVar3,4,local_1d8,local_1f8);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
        std::__cxx11::string::~string(local_1d8);
        if (((this->m_config).log_operation_history_after_error & 1U) != 0) {
          print_operation_history(this);
        }
      }
      this_local._7_1_ = 0;
      goto LAB_0012bfb7;
    }
    pmVar5 = &local_158->objects;
    local_21c = Stationary;
    std::make_pair<std::shared_ptr<CompiledGame::PrimaryObject>const&,PSEngine::ObjectMoveType>
              (&local_218,
               (shared_ptr<CompiledGame::PrimaryObject> *)
               &(dest_cell->objects)._M_t._M_impl.super__Rb_tree_header,&local_21c);
    std::
    map<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
    ::insert<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType>>
              ((map<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
                *)pmVar5,&local_218);
    std::pair<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>::~pair
              (&local_218);
    __gnu_cxx::
    __normal_iterator<ObjectMoveInfo_*,_std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>_>
    ::operator++(&__end1_1);
  }
  pvVar2 = &(this->m_current_level).cells;
  __end1_2 = std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::begin(pvVar2);
  cell_1 = (Cell *)std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::end(pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
                             *)&cell_1), bVar1) {
    current_col_layers._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
                 ::operator*(&__end1_2);
    sVar4 = std::
            map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
            ::size(&((reference)current_col_layers._M_t._M_impl.super__Rb_tree_header._M_node_count)
                    ->objects);
    if (1 < sVar4) {
      std::
      set<std::shared_ptr<CompiledGame::CollisionLayer>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
      ::set((set<std::shared_ptr<CompiledGame::CollisionLayer>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
             *)&__range2_2);
      pmVar5 = (map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                *)(current_col_layers._M_t._M_impl.super__Rb_tree_header._M_node_count + 8);
      __end2_2 = std::
                 map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                 ::begin(pmVar5);
      pair_1 = (pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *
               )std::
                map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                ::end(pmVar5);
      while (bVar1 = std::operator!=(&__end2_2,(_Self *)&pair_1), bVar1) {
        local_2a0 = std::
                    _Rb_tree_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>
                    ::operator*(&__end2_2);
        std::
        __shared_ptr_access<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_2a0);
        std::weak_ptr<CompiledGame::CollisionLayer>::lock
                  ((weak_ptr<CompiledGame::CollisionLayer> *)&local_2b0);
        sVar6 = std::
                set<std::shared_ptr<CompiledGame::CollisionLayer>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
                ::count((set<std::shared_ptr<CompiledGame::CollisionLayer>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
                         *)&__range2_2,&local_2b0);
        std::shared_ptr<CompiledGame::CollisionLayer>::~shared_ptr(&local_2b0);
        if (sVar6 != 0) {
          this_local._7_1_ = 0;
          bVar1 = true;
          goto LAB_0012bf70;
        }
        std::
        __shared_ptr_access<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_2a0);
        std::weak_ptr<CompiledGame::CollisionLayer>::lock
                  ((weak_ptr<CompiledGame::CollisionLayer> *)&local_2c0);
        std::
        set<std::shared_ptr<CompiledGame::CollisionLayer>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
        ::insert((set<std::shared_ptr<CompiledGame::CollisionLayer>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
                  *)&__range2_2,&local_2c0);
        std::shared_ptr<CompiledGame::CollisionLayer>::~shared_ptr(&local_2c0);
        std::
        _Rb_tree_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>
        ::operator++(&__end2_2);
      }
      bVar1 = false;
LAB_0012bf70:
      std::
      set<std::shared_ptr<CompiledGame::CollisionLayer>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
      ::~set((set<std::shared_ptr<CompiledGame::CollisionLayer>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
              *)&__range2_2);
      if (bVar1) goto LAB_0012bfb7;
    }
    __gnu_cxx::
    __normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
    ::operator++(&__end1_2);
  }
  this_local._7_1_ = 1;
LAB_0012bfb7:
  std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::~vector
            ((vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *)&__range1);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PSEngine::basic_movement_resolution()
{
    struct ObjectMoveInfo
    {
        PSVector2i origin;
        PSVector2i destination;

        shared_ptr<CompiledGame::PrimaryObject> obj;
    };

    vector<ObjectMoveInfo> objects_to_move;

    for(Cell& cell : m_current_level.cells)
    {
        vector<ObjectMoveInfo> current_cell_objects_to_move;

        for(auto& pair : cell.objects )
        {
            if(pair.second == ObjectMoveType::Action)
            {
                pair.second = ObjectMoveType::Stationary;
            }
            else if(pair.second != ObjectMoveType::Stationary)
            {
                if(pair.second == ObjectMoveType::None)
                {
                    PS_LOG_ERROR("an objec move type is set to none, this should never happen");
                    continue;
                }
                ObjectMoveInfo move_info;
                move_info.origin = cell.position;
                move_info.obj = pair.first;

                //if some movement is invalid, the whole basic movement resolution is invalid
                if( !get_move_destination_coord(cell.position,pair.second,move_info.destination))
                {
                    return false;
                }

                current_cell_objects_to_move.push_back(move_info);
            }
        }

        for(const auto& elem :current_cell_objects_to_move)
        {
            cell.objects.erase(elem.obj);

            objects_to_move.push_back(elem);
        }
    }

    for(const auto& move_info : objects_to_move)
    {
        //check if object is not already in cell
        Cell* dest_cell = get_cell_at(move_info.destination);

        if(dest_cell == nullptr)
        {
            PS_LOG_ERROR("should not happen!");
            return false;
        }

        if(dest_cell->objects.find(move_info.obj) != dest_cell->objects.end())
        {
            //moving objects were temporarily removed from the level so only static ones should be detected here
            PS_LOG_ERROR("this object already exist in the destination cell, basic movement resolution cannot proceed.");
            return false;
        }

        dest_cell->objects.insert(make_pair(move_info.obj, ObjectMoveType::Stationary));

    }

    //check if there's no collisions
    for(Cell& cell : m_current_level.cells)
    {
        if(cell.objects.size() <= 1)
        {
            continue;
        }

        set<shared_ptr<CompiledGame::CollisionLayer>> current_col_layers;

        for(auto& pair : cell.objects )
        {
            if( current_col_layers.count(pair.first->collision_layer.lock()) != 0)
            {
                return false; //collision was detected;
            }
            current_col_layers.insert(pair.first->collision_layer.lock());
        }
    }

    return true;
}